

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

statement_ptr __thiscall mjs::parser::parse_block(parser *this,bool check_for_strict_mode)

{
  bool in_DL;
  undefined7 in_register_00000031;
  parser *this_00;
  statement_list l;
  token local_78;
  token local_50;
  
  this_00 = (parser *)CONCAT71(in_register_00000031,check_for_strict_mode);
  expect(&local_50,this_00,lbrace,"parse_block",0x314);
  token::destroy(&local_50);
  parse_statement_list(&l,this_00,in_DL);
  expect(&local_78,this_00,rbrace,"parse_block",0x316);
  token::destroy(&local_78);
  make_statement<mjs::block_statement,std::vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>,bool&>
            (this,(vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                   *)this_00,(bool *)&l);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector(&l);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr parse_block(bool check_for_strict_mode = false) {
        EXPECT(token_type::lbrace);
        statement_list l = parse_statement_list(check_for_strict_mode);
        EXPECT(token_type::rbrace);
        return make_statement<block_statement>(std::move(l), strict_mode_);
    }